

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLMaterialRenderer.h
# Opt level: O2

void __thiscall
irr::video::COpenGLMaterialRenderer_TRANSPARENT_ALPHA_CHANNEL::OnUnsetMaterial
          (COpenGLMaterialRenderer_TRANSPARENT_ALPHA_CHANNEL *this)

{
  COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
  ::setActiveTexture(*(COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                       **)(*(long *)&(this->super_IMaterialRenderer).field_0x8 + 0xbe8),0x84c0);
  glTexEnvi(0x2300,0x2200,0x2100);
  glTexEnvi(0x2300,0x8572,0x2100);
  COpenGLCacheHandler::setAlphaTest
            (*(COpenGLCacheHandler **)(*(long *)&(this->super_IMaterialRenderer).field_0x8 + 0xbe8),
             false);
  COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
  ::setBlend(*(COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
               **)(*(long *)&(this->super_IMaterialRenderer).field_0x8 + 0xbe8),false);
  return;
}

Assistant:

void OnUnsetMaterial() override
	{
		Driver->getCacheHandler()->setActiveTexture(GL_TEXTURE0_ARB);

		glTexEnvi(GL_TEXTURE_ENV, GL_TEXTURE_ENV_MODE, GL_MODULATE);
#ifdef GL_ARB_texture_env_combine
		glTexEnvi(GL_TEXTURE_ENV, GL_COMBINE_ALPHA_ARB, GL_MODULATE);
#else
		glTexEnvi(GL_TEXTURE_ENV, GL_COMBINE_ALPHA_EXT, GL_MODULATE);
#endif
		Driver->getCacheHandler()->setAlphaTest(false);
		Driver->getCacheHandler()->setBlend(false);
	}